

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_link_32(m68k_info *info)

{
  uint uVar1;
  
  if ((info->type & 0x1c) != 0) {
    uVar1 = peek_imm_32(info);
    info->pc = info->pc + 4;
    MCInst_setOpcode(info->inst,0x115);
    (info->extension).op_count = '\x02';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    (info->extension).operands[0].address_mode = M68K_AM_NONE;
    (info->extension).operands[0].field_0.reg = (info->ir & 7) + M68K_REG_A0;
    (info->extension).operands[1].type = M68K_OP_IMM;
    (info->extension).operands[1].address_mode = M68K_AM_IMMEDIATE;
    (info->extension).operands[1].field_0 =
         (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)(int)uVar1;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_link_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_link(info, read_imm_32(info), 4);
}